

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ShuffleTests(UnitTestImpl *this)

{
  bool bVar1;
  TestSuite *this_00;
  reference ppTVar2;
  UnitTestImpl *in_RDI;
  TestSuite **test_suite;
  iterator __end2;
  iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  vector<int,_std::allocator<int>_> *in_stack_00000060;
  int in_stack_00000068;
  int in_stack_0000006c;
  Random *in_stack_00000070;
  TestSuite *in_stack_ffffffffffffffb8;
  __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_18;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *local_10;
  
  random(in_RDI);
  ShuffleRange<int>(in_stack_00000070,in_stack_0000006c,in_stack_00000068,in_stack_00000060);
  this_00 = (TestSuite *)random(in_RDI);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::size
            (&in_RDI->test_suites_);
  ShuffleRange<int>(in_stack_00000070,in_stack_0000006c,in_stack_00000068,in_stack_00000060);
  local_10 = &in_RDI->test_suites_;
  local_18._M_current =
       (TestSuite **)
       std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                 ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                  in_stack_ffffffffffffffb8);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
            ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
             in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                        *)this_00,
                       (__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&local_18);
    in_stack_ffffffffffffffb8 = *ppTVar2;
    random(in_RDI);
    TestSuite::ShuffleTests(this_00,(Random *)in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void UnitTestImpl::ShuffleTests() {
  // Shuffles the death test suites.
  ShuffleRange(random(), 0, last_death_test_suite_ + 1, &test_suite_indices_);

  // Shuffles the non-death test suites.
  ShuffleRange(random(), last_death_test_suite_ + 1,
               static_cast<int>(test_suites_.size()), &test_suite_indices_);

  // Shuffles the tests inside each test suite.
  for (auto& test_suite : test_suites_) {
    test_suite->ShuffleTests(random());
  }
}